

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_uint.c
# Opt level: O2

qcc_generator_ptr qcc_gen_uint_in_range(qcc_context *ctx,size_t size,qcc_uint min,qcc_uint max)

{
  qcc_uint min_00;
  qcc_uint max_00;
  qcc_generator_ptr pqVar1;
  qcc_generator_ptr pqVar2;
  qcc_generator_ptr pqVar3;
  qcc_generator_ptr pqVar4;
  qcc_generator_ptr pqVar5;
  qcc_generator_ptr pqVar6;
  qcc_generator_ptr pqVar7;
  ulong uVar8;
  
  min_00 = _limit_uint(size,min);
  max_00 = _limit_uint(size,max);
  if (max_00 < min_00) {
    __assert_fail("min <= max",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/src/qcc_uint.c"
                  ,0x6f,
                  "qcc_generator_ptr qcc_gen_uint_in_range(struct qcc_context *, size_t, qcc_uint, qcc_uint)"
                 );
  }
  if (max_00 - min_00 < 0x14) {
    pqVar1 = _gen_uint_in_range(ctx,size,min_00,max_00);
    return pqVar1;
  }
  uVar8 = max_00 - min_00 >> 1;
  pqVar1 = _gen_uint_in_range(ctx,size,min_00,min_00 + 2);
  pqVar2 = _gen_uint_in_range(ctx,size,max_00 - 2,max_00);
  pqVar3 = _gen_uint_in_range(ctx,size,(min_00 + uVar8) - 1,min_00 + uVar8 + 1);
  pqVar4 = _gen_uint_in_range(ctx,size,min_00,min_00 + 10);
  pqVar5 = _gen_uint_in_range(ctx,size,max_00 - 10,max_00);
  pqVar6 = _gen_uint_in_range(ctx,size,(min_00 + uVar8) - 5,min_00 + uVar8 + 5);
  pqVar7 = _gen_uint_in_range(ctx,size,min_00,max_00);
  pqVar1 = qcc_gen_one_of(ctx,pqVar1,pqVar2,pqVar3,pqVar4,pqVar5,pqVar6,pqVar7,0);
  return pqVar1;
}

Assistant:

qcc_generator_ptr qcc_gen_uint_in_range(struct qcc_context *ctx, size_t size,
                                        qcc_uint min, qcc_uint max)
{
    min = _limit_uint(size, min);
    max = _limit_uint(size, max);
    assert(min <= max);

    if (max - min < 20) return _gen_uint_in_range(ctx, size, min, max);

    qcc_uint avg = min + (max - min) / 2;
    return qcc_gen_one_of(ctx, _gen_uint_in_range(ctx, size, min, min + 2),
                          _gen_uint_in_range(ctx, size, max - 2, max),
                          _gen_uint_in_range(ctx, size, avg - 1, avg + 1),
                          _gen_uint_in_range(ctx, size, min, min + 10),
                          _gen_uint_in_range(ctx, size, max - 10, max),
                          _gen_uint_in_range(ctx, size, avg - 5, avg + 5),
                          _gen_uint_in_range(ctx, size, min, max), (void *)0);
}